

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_attributes.cpp
# Opt level: O0

uint __thiscall ON_3dmObjectAttributes::SizeOf(ON_3dmObjectAttributes *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint sz;
  ON_3dmObjectAttributes *this_local;
  
  iVar1 = ON_wString::Length(&this->m_name);
  iVar2 = ON_wString::Length(&this->m_url);
  uVar3 = ON_SimpleArray<int>::SizeOfArray(&this->m_group);
  uVar4 = ON_Object::SizeOf(&this->super_ON_Object);
  return iVar1 * 4 + 0x160 + iVar2 * 4 + uVar3 + uVar4;
}

Assistant:

unsigned int ON_3dmObjectAttributes::SizeOf() const
{
  unsigned int sz = sizeof(*this) - sizeof(ON_Object) 
                  + m_name.Length()*sizeof(wchar_t)
                  + m_url.Length()*sizeof(wchar_t)
                  + m_group.SizeOfArray()
                  + ON_Object::SizeOf();
  return sz;
}